

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O3

bool duckdb::TryAddOperator::Operation<duckdb::date_t,int,duckdb::date_t>
               (date_t left,int32_t right,date_t *result)

{
  bool bVar1;
  date_t input;
  
  if ((left.days != 0x7fffffff) && (left.days != -0x7fffffff)) {
    input.days = (int32_t)((long)right + (long)left.days);
    if ((long)input.days == (long)right + (long)left.days) {
      result->days = (int32_t)input;
      bVar1 = Value::IsFinite<duckdb::date_t>(input);
      return bVar1;
    }
    return false;
  }
  result->days = (int32_t)left;
  return true;
}

Assistant:

bool TryAddOperator::Operation(date_t left, int32_t right, date_t &result) {
	if (left == date_t::infinity() || left == date_t::ninfinity()) {
		result = date_t(left);
		return true;
	}
	int32_t days;
	if (!TryAddOperator::Operation(left.days, right, days)) {
		return false;
	}
	result.days = days;
	if (!Value::IsFinite(result)) {
		return false;
	}
	return true;
}